

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HSimplexNlaProductForm.cpp
# Opt level: O2

void __thiscall ProductFormUpdate::btran(ProductFormUpdate *this,HVector *rhs)

{
  ulong uVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  pointer piVar5;
  pointer piVar6;
  pointer pdVar7;
  pointer piVar8;
  pointer pdVar9;
  long lVar10;
  ulong uVar11;
  double dVar12;
  
  if (this->valid_ == true) {
    piVar5 = (this->pivot_index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar6 = (rhs->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar7 = (rhs->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar8 = (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar9 = (this->pivot_value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar11 = (ulong)(uint)this->update_count_;
    while (0 < (int)uVar11) {
      uVar1 = uVar11 - 1;
      iVar3 = piVar5[uVar1];
      dVar2 = pdVar7[iVar3];
      dVar12 = dVar2;
      for (lVar10 = (long)piVar8[uVar1]; lVar10 < piVar8[uVar11]; lVar10 = lVar10 + 1) {
        dVar12 = dVar12 - (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl
                          .super__Vector_impl_data._M_start[lVar10] *
                          pdVar7[(this->index_).super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_start[lVar10]];
      }
      dVar12 = dVar12 / pdVar9[uVar1];
      if ((dVar2 == 0.0) && (!NAN(dVar2))) {
        iVar4 = rhs->count;
        rhs->count = iVar4 + 1;
        piVar6[iVar4] = iVar3;
      }
      uVar11 = -(ulong)(ABS(dVar12) < 1e-14);
      pdVar7[iVar3] = (double)(~uVar11 & (ulong)dVar12 | uVar11 & 0x2b2bff2ee48e0530);
      uVar11 = uVar1;
    }
  }
  return;
}

Assistant:

void ProductFormUpdate::btran(HVector& rhs) const {
  if (!valid_) return;
  assert(rhs.size == num_row_);
  assert((int)start_.size() == update_count_ + 1);
  for (HighsInt iX = update_count_ - 1; iX >= 0; iX--) {
    const HighsInt pivot_index = pivot_index_[iX];
    double pivot_value = rhs.array[pivot_index];
    for (HighsInt iEl = start_[iX]; iEl < start_[iX + 1]; iEl++)
      pivot_value -= value_[iEl] * rhs.array[index_[iEl]];
    pivot_value /= pivot_value_[iX];
    if (rhs.array[pivot_index] == 0) rhs.index[rhs.count++] = pivot_index;
    rhs.array[pivot_index] =
        (fabs(pivot_value) < kHighsTiny) ? 1e-100 : pivot_value;
  }
}